

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat64x2OperationX86X64.cpp
# Opt level: O2

SIMDValue Js::SIMDFloat64x2Operation::OpSelect(SIMDValue *mV,SIMDValue *tV,SIMDValue *fV)

{
  return (SIMDValue)
         (anon_union_16_9_4d7543c8_for__SIMDValue_0)
         (~(undefined1  [16])mV->field_0 & (undefined1  [16])fV->field_0 |
         (undefined1  [16])tV->field_0 & (undefined1  [16])mV->field_0);
}

Assistant:

SIMDValue SIMDFloat64x2Operation::OpSelect(const SIMDValue& mV, const SIMDValue& tV, const SIMDValue& fV)
    {
        X86SIMDValue x86Result;
        X86SIMDValue maskValue  = X86SIMDValue::ToX86SIMDValue(mV);
        X86SIMDValue trueValue  = X86SIMDValue::ToX86SIMDValue(tV);
        X86SIMDValue falseValue = X86SIMDValue::ToX86SIMDValue(fV);

        X86SIMDValue tempTrue, tempFalse;
        tempTrue.m128d_value = _mm_and_pd(maskValue.m128d_value, trueValue.m128d_value);      // mask & True
        tempFalse.m128d_value = _mm_andnot_pd(maskValue.m128d_value, falseValue.m128d_value); // !mask & False
        x86Result.m128d_value = _mm_or_pd(tempTrue.m128d_value, tempFalse.m128d_value); // tempTrue | tempFalse

        return X86SIMDValue::ToSIMDValue(x86Result);
    }